

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void kratos::MultipleDriverVisitor::check_var(Var *var)

{
  uint uVar1;
  IRNodeKind IVar2;
  undefined8 *puVar3;
  long *plVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar6;
  IRNode *node2;
  bool bVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  undefined4 extraout_var;
  Var *pVVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar13;
  IRNode *node1;
  Stmt *pSVar14;
  mapped_type *pmVar15;
  _func_int **pp_Var16;
  long lVar17;
  StmtException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  Stmt *st;
  string_view format_str;
  format_args args;
  initializer_list<kratos::IRNode_*> __l;
  Var *local_e8;
  IRNode *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  unordered_map<unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>_>
  parents;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_78;
  undefined1 local_60 [8];
  shared_ptr<kratos::VarSlice> slice;
  allocator_type local_35;
  uint local_34;
  
  local_d0 = (undefined1  [8])&parents._M_h._M_rehash_policy._M_next_resize;
  parents._M_h._M_buckets = (__buckets_ptr)0x1;
  parents._M_h._M_bucket_count = 0;
  parents._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  parents._M_h._M_element_count._0_4_ = 0x3f800000;
  parents._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  parents._M_h._M_rehash_policy._4_4_ = 0;
  parents._M_h._M_rehash_policy._M_next_resize = 0;
  iVar9 = (*(var->super_IRNode)._vptr_IRNode[0x10])();
  puVar3 = *(undefined8 **)(CONCAT44(extraout_var,iVar9) + 0x10);
  do {
    if (puVar3 == (undefined8 *)0x0) {
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_d0);
      return;
    }
    bVar7 = has_for_loop((Stmt *)puVar3[1]);
    if (!bVar7) {
      plVar4 = *(long **)(puVar3[1] + 0xc0);
      pVVar12 = (Var *)(**(code **)(*plVar4 + 0x148))(plVar4);
      if (pVVar12 == var) {
        if ((int)plVar4[0x2d] == 2) {
          Var::as<kratos::VarSlice>((Var *)local_60);
          cVar8 = (**(code **)(*(_func_int **)local_60 + 0x158))();
          if (slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      );
          }
          if (cVar8 != '\0') goto LAB_0023876d;
        }
        uVar10 = (**(code **)(*plVar4 + 0x130))(plVar4);
        uVar11 = (**(code **)(*plVar4 + 0x128))(plVar4);
        while (local_34 = uVar10, uVar10 <= uVar11) {
          aVar5 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                   )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                      *)((long)local_d0 + ((ulong)uVar10 % (ulong)parents._M_h._M_buckets) * 8))->
                    values_;
          aVar13.values_ =
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0;
          if ((aVar5.values_ !=
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) &&
             (aVar6.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)((aVar5.values_)->field_0).named_args.data, aVar13 = aVar5,
             uVar10 != *(int *)((long)&(aVar6.values_)->field_0 + 8))) {
            while (in_R9 = aVar6,
                  aVar6.values_ =
                       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                        *)((in_R9.values_)->field_0).named_args.data,
                  (named_arg_info<char> *)aVar6.values_ != (named_arg_info<char> *)0x0) {
              uVar1 = *(int *)((long)&(aVar6.values_)->field_0 + 8);
              aVar13.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0;
              if (((ulong)uVar1 % (ulong)parents._M_h._M_buckets !=
                   (ulong)uVar10 % (ulong)parents._M_h._M_buckets) ||
                 (aVar13 = in_R9, uVar10 == uVar1)) goto LAB_00238658;
            }
            aVar13.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0;
          }
LAB_00238658:
          if ((aVar13.values_ ==
               (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)0x0) || (((aVar13.values_)->field_0).long_long_value == 0)) {
            pp_Var16 = (_func_int **)(**(code **)(*(long *)puVar3[1] + 0x20))();
            slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)non_gen_root_parent((Stmt *)puVar3[1]);
            local_60 = (undefined1  [8])pp_Var16;
            std::
            _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>,std::allocator<std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<unsigned_int&,std::pair<kratos::IRNode*,kratos::Stmt*>>
                      ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>,std::allocator<std::pair<unsigned_int_const,std::pair<kratos::IRNode*,kratos::Stmt*>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)local_d0,&local_34,local_60);
          }
          else {
            node1 = (IRNode *)(**(code **)(*(long *)puVar3[1] + 0x20))();
            pSVar14 = non_gen_root_parent((Stmt *)puVar3[1]);
            pmVar15 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>,_std::allocator<std::pair<const_unsigned_int,_std::pair<kratos::IRNode_*,_kratos::Stmt_*>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)local_d0,&local_34);
            bVar7 = pSVar14 == pmVar15->second;
            if (bVar7) {
              node2 = pmVar15->first;
              IVar2 = (pSVar14->super_IRNode).ast_node_type_;
              if (node1 == node2) {
                if ((IVar2 != StmtKind) || (pSVar14->type_ != Block)) goto LAB_00238798;
                lVar17 = __dynamic_cast(pSVar14,&Stmt::typeinfo,&StmtBlock::typeinfo,0);
                if ((*(int *)(lVar17 + 0xd8) != 0) && (*(int *)(lVar17 + 0xd8) != 5))
                goto LAB_00238798;
              }
              else if (((IVar2 == StmtKind) && (pSVar14->type_ == Block)) &&
                      (lVar17 = __dynamic_cast(pSVar14,&Stmt::typeinfo,&StmtBlock::typeinfo,0),
                      *(int *)(lVar17 + 0xd8) == 1)) {
                bVar7 = share_root(node1,node2);
                goto LAB_0023869a;
              }
            }
            else {
LAB_0023869a:
              if (!bVar7) {
LAB_00238798:
                this = (StmtException *)__cxa_allocate_exception(0x10);
                (*(var->super_IRNode)._vptr_IRNode[0x20])(&parents._M_h._M_single_bucket);
                local_78.super__Vector_base<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)parents._M_h._M_single_bucket;
                format_str.size_ = 0xd;
                format_str.data_ = (char *)0x29;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .field_1.args_ = in_R9.args_;
                args.
                super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                .desc_ = (unsigned_long_long)&local_78;
                fmt::v7::detail::vformat_abi_cxx11_
                          ((string *)local_60,(detail *)"{0} has multiple driver in the same scope",
                           format_str,args);
                local_d8 = puVar3[1];
                __l._M_len = 3;
                __l._M_array = (iterator)&local_e8;
                local_e8 = var;
                local_e0 = node1;
                std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
                          (&local_78,__l,&local_35);
                StmtException::StmtException(this,(string *)local_60,&local_78);
                __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
              }
            }
          }
          uVar10 = local_34 + 1;
        }
      }
    }
LAB_0023876d:
    puVar3 = (undefined8 *)*puVar3;
  } while( true );
}

Assistant:

static void check_var(Var* var) {
        std::unordered_map<uint32_t, std::pair<IRNode*, Stmt*>> parents;
        for (auto const& stmt : var->sources()) {
            // TODO: FIX THIS
            //  This is a hack to bypass the check if there is a for loop
            if (has_for_loop(stmt.get())) continue;
            auto* v = stmt->left();
            if (v->get_var_root_parent() != var) continue;
            if (v->type() == VarType::Slice) {
                auto slice = v->as<VarSlice>();
                if (slice->sliced_by_var()) continue;
            }
            uint32_t var_low = v->var_low();
            uint32_t var_high = v->var_high();
            for (uint32_t i = var_low; i <= var_high; i++) {
                if (parents.find(i) != parents.end()) {
                    auto* parent = stmt->parent();
                    auto* stmt_parent = non_gen_root_parent(stmt.get());
                    auto const& [ref_parent, ref_stmt_parent] = parents.at(i);
                    // the purpose of the following statement is to make sure that there is no
                    // other assignment that's assigning the same var slice in the same scope
                    // it cannot be driven through different blocks, either.
                    // notice that there is a caveat. in combinational block, as long as the
                    // they are in the same stmt parent, they can have different scope, since
                    // having different scope implies priority. as a result, we need to filter
                    // this case out
                    bool has_multiple_driver = stmt_parent != ref_stmt_parent;
                    if (!has_multiple_driver) {
                        // skip the special case
                        if (parent == ref_parent) {
                            has_multiple_driver = true;
                            if (stmt_parent->ir_node_kind() == IRNodeKind::StmtKind) {
                                auto* st = dynamic_cast<Stmt*>(stmt_parent);
                                if (st && st->type() == StatementType::Block) {
                                    auto* block = dynamic_cast<StmtBlock*>(st);
                                    if (block->block_type() == StatementBlockType::Combinational ||
                                        block->block_type() == StatementBlockType::Latch) {
                                        has_multiple_driver = false;
                                    }
                                }
                            }
                        } else {
                            if (stmt_parent->ir_node_kind() == IRNodeKind::StmtKind) {
                                auto* st = dynamic_cast<Stmt*>(stmt_parent);
                                if (st && st->type() == StatementType::Block) {
                                    auto* block = dynamic_cast<StmtBlock*>(st);
                                    if (block->block_type() == StatementBlockType::Sequential) {
                                        // TODO: this algorithm is not perfect as it only
                                        //  accounts for standalone assignments
                                        has_multiple_driver = !share_root(parent, ref_parent);
                                    }
                                }
                            }
                        }
                    }
                    if (has_multiple_driver) {
                        throw StmtException(::format("{0} has multiple driver in the same scope",
                                                     var->handle_name()),
                                            {var, parent, stmt.get()});
                    }
                } else {
                    parents.emplace(
                        i, std::make_pair(stmt->parent(), non_gen_root_parent(stmt.get())));
                }
            }
        }
    }